

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void __kmp_api_omp_set_default_device_(int *arg)

{
  kmp_int32 kVar1;
  int iVar2;
  
  kVar1 = *arg;
  iVar2 = __kmp_get_global_thread_id_reg();
  (((__kmp_threads[iVar2]->th).th_current_task)->td_icvs).default_device = kVar1;
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_DEFAULT_DEVICE)(int KMP_DEREF arg) {
#if KMP_MIC || KMP_OS_DARWIN || defined(KMP_STUB)
// Nothing.
#else
  __kmp_entry_thread()->th.th_current_task->td_icvs.default_device =
      KMP_DEREF arg;
#endif
}